

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

void deqp::gles3::Functional::randomPartition
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst,Random *rnd,
               int x,int y,int width,int height)

{
  uint uVar1;
  deBool dVar2;
  deUint32 dVar3;
  int width_00;
  ulong uVar4;
  int height_00;
  ulong uVar5;
  int iVar6;
  float fVar7;
  int local_4c;
  Vector<int,_4> local_40;
  
  uVar5 = (ulong)(uint)height;
  uVar4 = (ulong)(uint)width;
  local_4c = x;
  do {
    while( true ) {
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      width_00 = (int)uVar4;
      height_00 = (int)uVar5;
      if ((8 < width_00) && (0.4 < fVar7)) break;
LAB_00523506:
      if ((height_00 < 9) || (fVar7 <= 0.4)) {
        local_40.m_data[0] = local_4c;
        local_40.m_data[1] = y;
        local_40.m_data[2] = width_00;
        local_40.m_data[3] = height_00;
        std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
        emplace_back<tcu::Vector<int,4>>
                  ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)dst,&local_40);
        return;
      }
      uVar1 = (uint)(uVar5 >> 1);
      dVar3 = deRandom_getUint32(&rnd->m_rnd);
      iVar6 = (dVar3 % (uVar1 | 1) - (int)(uVar5 >> 2)) + uVar1;
      randomPartition(dst,rnd,local_4c,y,width_00,iVar6);
      y = y + iVar6;
      uVar5 = (ulong)(uint)(height_00 - iVar6);
    }
    dVar2 = deRandom_getBool(&rnd->m_rnd);
    if (dVar2 != 1) goto LAB_00523506;
    uVar1 = (uint)(uVar4 >> 1);
    dVar3 = deRandom_getUint32(&rnd->m_rnd);
    iVar6 = (dVar3 % (uVar1 | 1) - (int)(uVar4 >> 2)) + uVar1;
    randomPartition(dst,rnd,local_4c,y,iVar6,height_00);
    local_4c = local_4c + iVar6;
    uVar4 = (ulong)(uint)(width_00 - iVar6);
  } while( true );
}

Assistant:

static void randomPartition (vector<IVec4>& dst, de::Random& rnd, int x, int y, int width, int height)
{
	const int minWidth	= 8;
	const int minHeight	= 8;

	bool	partition		= rnd.getFloat() > 0.4f;
	bool	partitionX		= partition && width > minWidth && rnd.getBool();
	bool	partitionY		= partition && height > minHeight && !partitionX;

	if (partitionX)
	{
		int split = width/2 + rnd.getInt(-width/4, +width/4);
		randomPartition(dst, rnd, x, y, split, height);
		randomPartition(dst, rnd, x+split, y, width-split, height);
	}
	else if (partitionY)
	{
		int split = height/2 + rnd.getInt(-height/4, +height/4);
		randomPartition(dst, rnd, x, y, width, split);
		randomPartition(dst, rnd, x, y+split, width, height-split);
	}
	else
		dst.push_back(IVec4(x, y, width, height));
}